

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O2

int __thiscall
jrtplib::RTPUDPv6Transmitter::AddDestination(RTPUDPv6Transmitter *this,RTPAddress *addr)

{
  undefined8 uVar1;
  int iVar2;
  ushort uVar3;
  RTPIPv6Destination dest;
  
  if (this->init == true) {
    if (this->created == true) {
      if (addr->addresstype == IPv6Address) {
        dest.rtcpaddr.sin6_addr.__in6_u._0_8_ = *(undefined8 *)&addr->field_0xc;
        uVar1 = *(undefined8 *)((long)&addr[1]._vptr_RTPAddress + 4);
        dest.rtpaddr.sin6_flowinfo = 0;
        dest.rtpaddr.sin6_scope_id = 0;
        dest.rtcpaddr.sin6_scope_id = 0;
        uVar3 = (ushort)*(undefined4 *)&addr[1].field_0xc;
        dest.rtpaddr.sin6_port = uVar3 << 8 | uVar3 >> 8;
        dest.rtpaddr.sin6_family = 10;
        dest.rtpaddr.sin6_addr.__in6_u.__u6_addr32[0] =
             (uint32_t)dest.rtcpaddr.sin6_addr.__in6_u._0_8_;
        dest.rtpaddr.sin6_addr.__in6_u.__u6_addr32[1] =
             (uint32_t)((ulong)dest.rtcpaddr.sin6_addr.__in6_u._0_8_ >> 0x20);
        dest.rtpaddr.sin6_addr.__in6_u.__u6_addr32[2] = (uint32_t)uVar1;
        dest.rtpaddr.sin6_addr.__in6_u.__u6_addr32[3] = (uint32_t)((ulong)uVar1 >> 0x20);
        dest.rtcpaddr.sin6_port = (uVar3 + 1) * 0x100 | (ushort)(uVar3 + 1) >> 8;
        dest.rtcpaddr.sin6_family = 10;
        dest.rtcpaddr.sin6_flowinfo = 0;
        dest.rtcpaddr.sin6_addr.__in6_u.__u6_addr32[2] =
             dest.rtpaddr.sin6_addr.__in6_u.__u6_addr32[2];
        dest.rtcpaddr.sin6_addr.__in6_u.__u6_addr32[3] =
             dest.rtpaddr.sin6_addr.__in6_u.__u6_addr32[3];
        iVar2 = RTPHashTable<const_jrtplib::RTPIPv6Destination,_jrtplib::RTPUDPv6Trans_GetHashIndex_IPv6Dest,_8317>
                ::AddElement(&this->destinations,&dest);
        return iVar2;
      }
      dest.rtcpaddr.sin6_addr.__in6_u.__u6_addr32[3] = 0xffffff94;
    }
    else {
      dest.rtcpaddr.sin6_addr.__in6_u.__u6_addr32[3] = 0xffffff8f;
    }
  }
  else {
    dest.rtcpaddr.sin6_addr.__in6_u.__u6_addr32[3] = 0xffffff8e;
  }
  return dest.rtcpaddr.sin6_addr.__in6_u.__u6_addr32[3];
}

Assistant:

int RTPUDPv6Transmitter::AddDestination(const RTPAddress &addr)
{
	if (!init)
		return ERR_RTP_UDPV6TRANS_NOTINIT;
	
	MAINMUTEX_LOCK

	if (!created)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_NOTCREATED;
	}
	if (addr.GetAddressType() != RTPAddress::IPv6Address)
	{
		MAINMUTEX_UNLOCK
		return ERR_RTP_UDPV6TRANS_INVALIDADDRESSTYPE;
	}
	
	RTPIPv6Address &address = (RTPIPv6Address &)addr;
	RTPIPv6Destination dest(address.GetIP(),address.GetPort());
	int status = destinations.AddElement(dest);

	MAINMUTEX_UNLOCK
	return status;
}